

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::peer_alert::~peer_alert(peer_alert *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

struct TORRENT_EXPORT peer_alert : torrent_alert
	{
		// internal
		peer_alert(aux::stack_allocator& alloc, torrent_handle const& h,
			tcp::endpoint const& i, peer_id const& pi);
		peer_alert(peer_alert&& rhs) noexcept = default;

#if TORRENT_ABI_VERSION == 1
		static const int TORRENT_DEPRECATED_MEMBER alert_type = 1;
#endif

		std::string message() const override;

		// The peer's IP address and port.
		aux::noexcept_movable<tcp::endpoint> endpoint;

		// the peer ID, if known.
		peer_id pid;

#if TORRENT_ABI_VERSION == 1
		// The peer's IP address and port.
		aux::noexcept_movable<tcp::endpoint> TORRENT_DEPRECATED_MEMBER ip;
#endif
	}